

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorRcc.cxx
# Opt level: O1

bool __thiscall cmQtAutoGeneratorRcc::GenerateRcc(cmQtAutoGeneratorRcc *this)

{
  ReadOnlyProcessT *pRVar1;
  bool bVar2;
  string emsg;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  
  bVar2 = true;
  if (this->Generate_ == true) {
    pRVar1 = (this->Process_)._M_t.
             super___uniq_ptr_impl<cmQtAutoGenerator::ReadOnlyProcessT,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmQtAutoGenerator::ReadOnlyProcessT_*,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
             .super__Head_base<0UL,_cmQtAutoGenerator::ReadOnlyProcessT_*,_false>._M_head_impl;
    if (pRVar1 == (ReadOnlyProcessT *)0x0) {
      local_68._0_8_ = (pointer)0x0;
      local_68._8_8_ = (pointer)0x0;
      local_68._16_8_ = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68,&this->RccExecutable_);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_68,
                 local_68._8_8_,
                 (this->Options_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (this->Options_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_68,
                 (char (*) [3])"-o");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68,&this->RccFileOutput_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68,&this->QrcFile_);
      bVar2 = StartProcess(this,&this->AutogenBuildDir_,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_68,true);
      bVar2 = !bVar2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_68);
    }
    else if (pRVar1->IsFinished_ == true) {
      if ((((this->ProcessResult_).ExitStatus == 0) && ((this->ProcessResult_).TermSignal == 0)) &&
         ((this->ProcessResult_).ErrorMessage._M_string_length == 0)) {
        if ((this->ProcessResult_).StdOut._M_string_length != 0) {
          cmQtAutoGenerator::Logger::Info
                    (&(this->super_cmQtAutoGenerator).Logger_,RCC,&(this->ProcessResult_).StdOut);
        }
        this->BuildFileChanged_ = true;
      }
      else {
        local_68._0_8_ = (pointer)(local_68 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"The rcc process failed to compile\n  ","");
        cmQtAutoGen::Quoted((string *)&local_48,&this->QrcFile_);
        std::__cxx11::string::_M_append(local_68,local_48._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_allocated_capacity != &local_38) {
          operator_delete((void *)local_48._M_allocated_capacity,local_38._M_allocated_capacity + 1)
          ;
        }
        std::__cxx11::string::append(local_68);
        cmQtAutoGen::Quoted((string *)&local_48,&this->RccFileOutput_);
        std::__cxx11::string::_M_append(local_68,local_48._M_allocated_capacity);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_allocated_capacity != &local_38) {
          operator_delete((void *)local_48._M_allocated_capacity,local_38._M_allocated_capacity + 1)
          ;
        }
        if ((((this->ProcessResult_).ExitStatus != 0) || ((this->ProcessResult_).TermSignal != 0))
           || ((this->ProcessResult_).ErrorMessage._M_string_length != 0)) {
          std::__cxx11::string::append(local_68);
          std::__cxx11::string::_M_append
                    (local_68,(ulong)(this->ProcessResult_).ErrorMessage._M_dataplus._M_p);
        }
        cmQtAutoGenerator::Logger::ErrorCommand
                  (&(this->super_cmQtAutoGenerator).Logger_,RCC,(string *)local_68,
                   &(((this->Process_)._M_t.
                      super___uniq_ptr_impl<cmQtAutoGenerator::ReadOnlyProcessT,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmQtAutoGenerator::ReadOnlyProcessT_*,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
                      .super__Head_base<0UL,_cmQtAutoGenerator::ReadOnlyProcessT_*,_false>.
                     _M_head_impl)->Setup_).Command,&(this->ProcessResult_).StdOut);
        if ((pointer)local_68._0_8_ != (pointer)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
        }
        cmQtAutoGenerator::FileSystem::FileRemove
                  (&(this->super_cmQtAutoGenerator).FileSys_,&this->RccFileOutput_);
        this->Error_ = true;
      }
      std::
      __uniq_ptr_impl<cmQtAutoGenerator::ReadOnlyProcessT,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
      ::reset((__uniq_ptr_impl<cmQtAutoGenerator::ReadOnlyProcessT,_std::default_delete<cmQtAutoGenerator::ReadOnlyProcessT>_>
               *)&this->Process_,(pointer)0x0);
      cmQtAutoGenerator::ProcessResultT::reset(&this->ProcessResult_);
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool cmQtAutoGeneratorRcc::GenerateRcc()
{
  if (!Generate_) {
    // Nothing to do
    return true;
  }

  if (Process_) {
    // Process is running already
    if (Process_->IsFinished()) {
      // Process is finished
      if (!ProcessResult_.error()) {
        // Rcc process success
        // Print rcc output
        if (!ProcessResult_.StdOut.empty()) {
          Log().Info(GenT::RCC, ProcessResult_.StdOut);
        }
        BuildFileChanged_ = true;
      } else {
        // Rcc process failed
        {
          std::string emsg = "The rcc process failed to compile\n  ";
          emsg += Quoted(QrcFile_);
          emsg += "\ninto\n  ";
          emsg += Quoted(RccFileOutput_);
          if (ProcessResult_.error()) {
            emsg += "\n";
            emsg += ProcessResult_.ErrorMessage;
          }
          Log().ErrorCommand(GenT::RCC, emsg, Process_->Setup().Command,
                             ProcessResult_.StdOut);
        }
        FileSys().FileRemove(RccFileOutput_);
        Error_ = true;
      }
      // Clean up
      Process_.reset();
      ProcessResult_.reset();
    } else {
      // Process is not finished, yet.
      return false;
    }
  } else {
    // Start a rcc process
    std::vector<std::string> cmd;
    cmd.push_back(RccExecutable_);
    cmd.insert(cmd.end(), Options_.begin(), Options_.end());
    cmd.emplace_back("-o");
    cmd.push_back(RccFileOutput_);
    cmd.push_back(QrcFile_);
    // We're done here if the process fails to start
    return !StartProcess(AutogenBuildDir_, cmd, true);
  }

  return true;
}